

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

Vec_Ptr_t * Pdr_ManCollectCubes(Pdr_Man_t *p,int kStart)

{
  Vec_Ptr_t *pVVar1;
  void **__ptr;
  Vec_Ptr_t *p_00;
  void *pvVar2;
  long lVar3;
  int i;
  uint uVar4;
  uint uVar5;
  
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 100;
  pVVar1->nSize = 0;
  __ptr = (void **)malloc(800);
  pVVar1->pArray = __ptr;
  lVar3 = 0;
  uVar5 = 100;
  while( true ) {
    if (p->vClauses->nSize <= kStart) break;
    p_00 = Vec_VecEntry(p->vClauses,kStart);
    lVar3 = (long)(int)lVar3;
    for (i = 0; i < p_00->nSize; i = i + 1) {
      pvVar2 = Vec_PtrEntry(p_00,i);
      if ((uint)lVar3 == uVar5) {
        uVar4 = uVar5 * 2;
        if ((int)uVar5 < 0x10) {
          uVar4 = 0x10;
        }
        if ((int)uVar5 < (int)uVar4) {
          if (__ptr == (void **)0x0) {
            __ptr = (void **)malloc((ulong)uVar4 << 3);
          }
          else {
            __ptr = (void **)realloc(__ptr,(ulong)uVar4 << 3);
          }
          pVVar1->pArray = __ptr;
          pVVar1->nCap = uVar4;
          uVar5 = uVar4;
        }
      }
      __ptr[lVar3] = pvVar2;
      lVar3 = lVar3 + 1;
      pVVar1->nSize = (int)lVar3;
    }
    kStart = kStart + 1;
  }
  return pVVar1;
}

Assistant:

Vec_Ptr_t * Pdr_ManCollectCubes( Pdr_Man_t * p, int kStart )
{
    Vec_Ptr_t * vResult;
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pSet;
    int i, j;
    vResult = Vec_PtrAlloc( 100 );
    Vec_VecForEachLevelStart( p->vClauses, vArrayK, i, kStart )
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pSet, j )
            Vec_PtrPush( vResult, pSet );
    return vResult;
}